

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctfst.c
# Opt level: O1

void jpeg_fdct_ifast(DCTELEM *data)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  unkbyte10 Var8;
  unkbyte10 Var9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar25;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  short sVar26;
  undefined4 uVar27;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  short sVar38;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  short sVar53;
  undefined1 auVar54 [12];
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  short sVar72;
  uint uVar73;
  undefined1 auVar74 [12];
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar91;
  short sVar92;
  short sVar93;
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  uint uVar89;
  long lVar90;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  short sVar94;
  short sVar95;
  int iVar194;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  short sVar121;
  uint uVar122;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  uint uVar123;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [16];
  short sVar130;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  short sVar141;
  short sVar142;
  short sVar143;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  short sVar144;
  short sVar147;
  short sVar148;
  short sVar149;
  short sVar150;
  short sVar151;
  short sVar152;
  short sVar153;
  short sVar154;
  short sVar155;
  short sVar156;
  short sVar157;
  short sVar158;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  short sVar159;
  short sVar163;
  short sVar165;
  short sVar168;
  short sVar170;
  short sVar172;
  short sVar173;
  short sVar174;
  undefined1 auVar160 [16];
  short sVar164;
  short sVar166;
  short sVar167;
  short sVar169;
  short sVar171;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  uint uVar184;
  ushort uVar185;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar96 [12];
  undefined1 auVar110 [16];
  undefined1 auVar101 [16];
  undefined1 auVar111 [16];
  undefined1 auVar102 [16];
  undefined1 auVar112 [16];
  undefined1 auVar190 [16];
  
  sVar144 = data[7] + *data;
  sVar147 = data[0xf] + data[8];
  sVar148 = data[0x17] + data[0x10];
  sVar149 = data[0x1f] + data[0x18];
  sVar151 = data[0x27] + data[0x20];
  sVar153 = data[0x2f] + data[0x28];
  sVar155 = data[0x37] + data[0x30];
  sVar157 = data[0x3f] + data[0x38];
  sVar130 = *data - data[7];
  sVar137 = data[8] - data[0xf];
  sVar138 = data[0x10] - data[0x17];
  sVar139 = data[0x18] - data[0x1f];
  sVar140 = data[0x20] - data[0x27];
  sVar141 = data[0x28] - data[0x2f];
  sVar142 = data[0x30] - data[0x37];
  sVar143 = data[0x38] - data[0x3f];
  sVar53 = data[6] + data[1];
  sVar65 = data[0xe] + data[9];
  sVar66 = data[0x16] + data[0x11];
  sVar67 = data[0x1e] + data[0x19];
  sVar68 = data[0x26] + data[0x21];
  sVar69 = data[0x2e] + data[0x29];
  sVar70 = data[0x36] + data[0x31];
  sVar71 = data[0x3e] + data[0x39];
  sVar38 = data[1] - data[6];
  sVar42 = data[9] - data[0xe];
  sVar43 = data[0x11] - data[0x16];
  sVar44 = data[0x19] - data[0x1e];
  sVar45 = data[0x21] - data[0x26];
  sVar46 = data[0x29] - data[0x2e];
  sVar47 = data[0x31] - data[0x36];
  sVar48 = data[0x39] - data[0x3e];
  sVar72 = data[5] + data[2];
  sVar85 = data[0xd] + data[10];
  sVar86 = data[0x15] + data[0x12];
  sVar87 = data[0x1d] + data[0x1a];
  sVar88 = data[0x25] + data[0x22];
  sVar91 = data[0x2d] + data[0x2a];
  sVar92 = data[0x35] + data[0x32];
  sVar93 = data[0x3d] + data[0x3a];
  sVar26 = data[2] - data[5];
  sVar31 = data[10] - data[0xd];
  sVar32 = data[0x12] - data[0x15];
  sVar33 = data[0x1a] - data[0x1d];
  sVar34 = data[0x22] - data[0x25];
  sVar35 = data[0x2a] - data[0x2d];
  sVar36 = data[0x32] - data[0x35];
  sVar37 = data[0x3a] - data[0x3d];
  sVar94 = data[4] + data[3];
  sVar114 = data[0xc] + data[0xb];
  sVar116 = data[0x14] + data[0x13];
  sVar118 = data[0x1c] + data[0x1b];
  sVar120 = data[0x24] + data[0x23];
  sVar124 = data[0x2c] + data[0x2b];
  sVar126 = data[0x34] + data[0x33];
  sVar128 = data[0x3c] + data[0x3b];
  sVar159 = sVar94 + sVar144;
  sVar163 = sVar114 + sVar147;
  sVar165 = sVar116 + sVar148;
  sVar168 = sVar118 + sVar149;
  sVar170 = sVar120 + sVar151;
  sVar172 = sVar124 + sVar153;
  sVar173 = sVar126 + sVar155;
  sVar174 = sVar128 + sVar157;
  sVar144 = sVar144 - sVar94;
  sVar147 = sVar147 - sVar114;
  sVar148 = sVar148 - sVar116;
  sVar149 = sVar149 - sVar118;
  sVar151 = sVar151 - sVar120;
  sVar153 = sVar153 - sVar124;
  sVar155 = sVar155 - sVar126;
  sVar157 = sVar157 - sVar128;
  sVar95 = sVar72 + sVar53;
  sVar115 = sVar85 + sVar65;
  sVar117 = sVar86 + sVar66;
  sVar119 = sVar87 + sVar67;
  sVar121 = sVar88 + sVar68;
  sVar125 = sVar91 + sVar69;
  sVar127 = sVar92 + sVar70;
  sVar129 = sVar93 + sVar71;
  sVar67 = sVar67 - sVar87;
  sVar94 = sVar159 + sVar95;
  sVar114 = sVar163 + sVar115;
  sVar120 = sVar165 + sVar117;
  sVar126 = sVar168 + sVar119;
  sVar128 = sVar170 + sVar121;
  sVar118 = sVar172 + sVar125;
  sVar116 = sVar173 + sVar127;
  sVar124 = sVar174 + sVar129;
  sVar159 = sVar159 - sVar95;
  sVar163 = sVar163 - sVar115;
  sVar165 = sVar165 - sVar117;
  sVar168 = sVar168 - sVar119;
  sVar170 = sVar170 - sVar121;
  sVar172 = sVar172 - sVar125;
  sVar173 = sVar173 - sVar127;
  sVar174 = sVar174 - sVar129;
  Var8 = CONCAT64(CONCAT42(CONCAT22(sVar67,sVar87),sVar66 - sVar86),CONCAT22(sVar86,sVar87));
  auVar3._4_8_ = (long)((unkuint10)Var8 >> 0x10);
  auVar3._2_2_ = sVar65 - sVar85;
  auVar3._0_2_ = sVar85;
  Var9 = CONCAT64(CONCAT42(CONCAT22(sVar149,sVar119),sVar148),CONCAT22(sVar117,sVar119));
  auVar4._4_8_ = (long)((unkuint10)Var9 >> 0x10);
  auVar4._2_2_ = sVar147;
  auVar4._0_2_ = sVar115;
  auVar97._0_4_ = (int)sVar144 + (int)(short)(sVar53 - sVar72);
  auVar97._4_4_ = (auVar4._0_4_ >> 0x10) + (auVar3._0_4_ >> 0x10);
  auVar97._8_4_ =
       ((int)((unkuint10)Var9 >> 0x10) >> 0x10) + ((int)((unkuint10)Var8 >> 0x10) >> 0x10);
  auVar97._12_4_ = (int)sVar149 + (int)sVar67;
  auVar75._0_4_ = (int)sVar151 + (int)(short)(sVar68 - sVar88);
  auVar75._4_4_ = (int)sVar153 + (int)(short)(sVar69 - sVar91);
  auVar75._8_4_ = (int)sVar155 + (int)(short)(sVar70 - sVar92);
  auVar75._12_4_ = (int)sVar157 + (int)(short)(sVar71 - sVar93);
  auVar55._4_4_ = auVar97._4_4_;
  auVar55._0_4_ = auVar97._4_4_;
  auVar55._8_4_ = auVar97._12_4_;
  auVar55._12_4_ = auVar97._12_4_;
  auVar56._4_4_ = auVar75._4_4_;
  auVar56._0_4_ = auVar75._4_4_;
  auVar56._8_4_ = auVar75._12_4_;
  auVar56._12_4_ = auVar75._12_4_;
  auVar77._0_4_ = (int)((ulong)auVar75._0_4_ * 0xb500) >> 0x10;
  auVar74._0_8_ = CONCAT44((int)((ulong)auVar75._4_4_ * 0xb500) >> 0x10,auVar77._0_4_);
  auVar74._8_4_ = (int)((auVar75._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar76._12_4_ = (int)((auVar56._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar76._0_12_ = auVar74;
  auVar98._0_4_ = auVar97._0_4_ * 0xb500 >> 0x10;
  auVar98._4_4_ = auVar97._4_4_ * 0xb500 >> 0x10;
  auVar98._8_4_ = (int)((auVar97._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar98._12_4_ = (int)((auVar55._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar99 = packssdw(auVar98,auVar76);
  sVar65 = sVar144 + auVar99._0_2_;
  sVar88 = auVar99._2_2_;
  sVar92 = auVar99._4_2_;
  sVar95 = auVar99._6_2_;
  sVar66 = sVar151 + auVar99._8_2_;
  sVar67 = sVar153 + auVar99._10_2_;
  sVar68 = sVar155 + auVar99._12_2_;
  sVar69 = sVar157 + auVar99._14_2_;
  sVar144 = sVar144 - auVar99._0_2_;
  sVar150 = sVar149 - sVar95;
  sVar151 = sVar151 - auVar99._8_2_;
  sVar153 = sVar153 - auVar99._10_2_;
  sVar155 = sVar155 - auVar99._12_2_;
  sVar157 = sVar157 - auVar99._14_2_;
  auVar102._0_12_ = auVar99._0_12_;
  auVar102._12_2_ = sVar95;
  auVar102._14_2_ = (data[0x1b] + sVar33) - data[0x1c];
  auVar101._12_4_ = auVar102._12_4_;
  auVar101._0_10_ = auVar99._0_10_;
  auVar101._10_2_ = (data[0x13] + sVar32) - data[0x14];
  auVar100._10_6_ = auVar101._10_6_;
  auVar100._0_8_ = auVar99._0_8_;
  auVar100._8_2_ = sVar92;
  auVar5._4_8_ = auVar100._8_8_;
  auVar5._2_2_ = (data[0xb] + sVar31) - data[0xc];
  auVar5._0_2_ = sVar88;
  auVar103._0_4_ = (int)(short)((data[3] + sVar26) - data[4]);
  auVar103._4_4_ = auVar5._0_4_ >> 0x10;
  auVar103._8_4_ = auVar100._8_4_ >> 0x10;
  auVar103._12_4_ = auVar101._12_4_ >> 0x10;
  auVar160._0_4_ = (int)(short)((data[0x23] + sVar34) - data[0x24]);
  auVar160._4_4_ = (int)(short)((data[0x2b] + sVar35) - data[0x2c]);
  auVar160._8_4_ = (int)(short)((data[0x33] + sVar36) - data[0x34]);
  auVar160._12_4_ = (int)(short)((data[0x3b] + sVar37) - data[0x3c]);
  sVar53 = (short)((ulong)auVar75._4_4_ * 0xb500 >> 0x10);
  auVar80._12_2_ = sVar53 >> 0xf;
  auVar80._0_12_ = auVar74;
  auVar80._14_2_ = sVar44 + sVar139;
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._0_10_ = auVar74._0_10_;
  auVar79._10_2_ = sVar43 + sVar138;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = sVar53;
  auVar78._0_8_ = auVar74._0_8_;
  auVar77._8_8_ = auVar78._8_8_;
  auVar77._6_2_ = sVar42 + sVar137;
  auVar77._4_2_ = (short)((ulong)auVar75._0_4_ * 0xb500 >> 0x10) >> 0xf;
  auVar81._0_4_ = (int)(short)(sVar38 + sVar130);
  auVar81._4_4_ = auVar77._4_4_ >> 0x10;
  auVar81._8_4_ = auVar78._8_4_ >> 0x10;
  auVar81._12_4_ = auVar79._12_4_ >> 0x10;
  auVar57._0_4_ = (int)(short)(sVar45 + sVar140);
  auVar57._4_4_ = (uint)(short)(sVar46 + sVar141);
  auVar57._8_4_ = (int)(short)(sVar47 + sVar142);
  auVar57._12_4_ = (int)(short)(sVar48 + sVar143);
  auVar49._0_4_ = auVar160._0_4_ - auVar57._0_4_;
  auVar49._4_4_ = auVar160._4_4_ - auVar57._4_4_;
  auVar49._8_4_ = auVar160._8_4_ - auVar57._8_4_;
  auVar49._12_4_ = auVar160._12_4_ - auVar57._12_4_;
  auVar178._0_4_ = auVar103._0_4_ - auVar81._0_4_;
  auVar178._4_4_ = auVar103._4_4_ - auVar81._4_4_;
  auVar178._8_4_ = auVar103._8_4_ - auVar81._8_4_;
  auVar178._12_4_ = auVar103._12_4_ - auVar81._12_4_;
  auVar39._4_4_ = auVar160._4_4_;
  auVar39._0_4_ = auVar160._4_4_;
  auVar39._8_4_ = auVar160._12_4_;
  auVar39._12_4_ = auVar160._12_4_;
  auVar40._4_4_ = auVar103._4_4_;
  auVar40._0_4_ = auVar103._4_4_;
  auVar40._8_4_ = auVar103._12_4_;
  auVar40._12_4_ = auVar103._12_4_;
  auVar104._4_4_ = auVar178._4_4_;
  auVar104._0_4_ = auVar178._4_4_;
  auVar104._8_4_ = auVar178._12_4_;
  auVar104._12_4_ = auVar178._12_4_;
  uVar184 = (uint)((auVar178._8_8_ & 0xffffffff) * 0x6200);
  uVar122 = (uint)((auVar104._8_8_ & 0xffffffff) * 0x6200);
  auVar105._4_4_ = auVar49._4_4_;
  auVar105._0_4_ = auVar49._4_4_;
  auVar105._8_4_ = auVar49._12_4_;
  auVar105._12_4_ = auVar49._12_4_;
  uVar25 = (uint)((auVar49._8_8_ & 0xffffffff) * 0x6200);
  uVar123 = (uint)((auVar105._8_8_ & 0xffffffff) * 0x6200);
  auVar106._4_4_ = auVar81._4_4_;
  auVar106._0_4_ = auVar81._4_4_;
  auVar106._8_4_ = auVar81._12_4_;
  auVar106._12_4_ = auVar81._12_4_;
  auVar82._4_4_ = auVar57._4_4_;
  auVar82._0_4_ = auVar57._4_4_;
  auVar82._8_4_ = auVar57._12_4_;
  auVar82._12_4_ = auVar57._12_4_;
  lVar90 = (auVar82._8_8_ & 0xffffffff) * 0x14e00;
  uVar73 = (uint)((ulong)auVar57._4_4_ * 0x14e00);
  uVar89 = (uint)lVar90;
  auVar54._0_8_ = CONCAT44(uVar89,uVar73);
  auVar54._8_4_ = uVar89;
  auVar61._12_2_ = (short)((ulong)lVar90 >> 0x10);
  auVar61._0_12_ = auVar54;
  auVar61._14_2_ = sVar33 + sVar44;
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._0_10_ = auVar54._0_10_;
  auVar60._10_2_ = sVar32 + sVar43;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._8_2_ = (short)lVar90;
  auVar59._0_8_ = auVar54._0_8_;
  auVar58._8_8_ = auVar59._8_8_;
  auVar58._6_2_ = sVar31 + sVar42;
  auVar58._4_2_ = (short)((ulong)auVar57._4_4_ * 0x14e00 >> 0x10);
  auVar58._0_4_ = uVar73;
  auVar62._0_4_ = (int)(short)(sVar26 + sVar38);
  auVar62._4_4_ = auVar58._4_4_ >> 0x10;
  auVar62._8_4_ = auVar59._8_4_ >> 0x10;
  auVar62._12_4_ = auVar60._12_4_ >> 0x10;
  auVar83._4_4_ = auVar62._4_4_;
  auVar83._0_4_ = auVar62._4_4_;
  auVar83._8_4_ = auVar62._12_4_;
  auVar83._12_4_ = auVar62._12_4_;
  auVar28._0_4_ = (int)(short)(sVar34 + sVar45);
  auVar28._4_4_ = (int)(short)(sVar35 + sVar46);
  auVar28._8_4_ = (int)(short)(sVar36 + sVar47);
  auVar28._12_4_ = (int)(short)(sVar37 + sVar48);
  auVar84._4_4_ = auVar28._4_4_;
  auVar84._0_4_ = auVar28._4_4_;
  auVar84._8_4_ = auVar28._12_4_;
  auVar84._12_4_ = auVar28._12_4_;
  auVar29._0_4_ = auVar28._0_4_ * 0xb500 >> 0x10;
  auVar29._4_4_ = auVar28._4_4_ * 0xb500 >> 0x10;
  auVar29._8_4_ = (int)((auVar28._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar29._12_4_ = (int)((auVar84._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar63._0_4_ = auVar62._0_4_ * 0xb500 >> 0x10;
  auVar63._4_4_ = auVar62._4_4_ * 0xb500 >> 0x10;
  auVar63._8_4_ = (int)((auVar62._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar63._12_4_ = (int)((auVar83._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar99 = packssdw(auVar63,auVar29);
  sVar48 = sVar130 + auVar99._0_2_;
  sVar70 = sVar137 + auVar99._2_2_;
  sVar72 = sVar138 + auVar99._4_2_;
  sVar85 = sVar139 + auVar99._6_2_;
  sVar86 = sVar140 + auVar99._8_2_;
  sVar26 = sVar141 + auVar99._10_2_;
  sVar53 = sVar142 + auVar99._12_2_;
  sVar31 = sVar143 + auVar99._14_2_;
  sVar130 = sVar130 - auVar99._0_2_;
  sVar137 = sVar137 - auVar99._2_2_;
  sVar138 = sVar138 - auVar99._4_2_;
  sVar139 = sVar139 - auVar99._6_2_;
  sVar140 = sVar140 - auVar99._8_2_;
  sVar141 = sVar141 - auVar99._10_2_;
  sVar142 = sVar142 - auVar99._12_2_;
  sVar143 = sVar143 - auVar99._14_2_;
  auVar192._0_4_ = (int)((auVar49._0_4_ * 0x6200 & 0xffff0000U) + auVar160._0_4_ * 0x8b00) >> 0x10;
  auVar192._4_4_ = (int)((auVar49._4_4_ * 0x6200 & 0xffff0000U) + auVar160._4_4_ * 0x8b00) >> 0x10;
  auVar192._8_4_ =
       (int)((uVar25 & 0xffff0000) + (int)((auVar160._8_8_ & 0xffffffff) * 0x8b00)) >> 0x10;
  auVar192._12_4_ =
       (int)((uVar123 & 0xffff0000) + (int)((auVar39._8_8_ & 0xffffffff) * 0x8b00)) >> 0x10;
  auVar179._0_4_ = (int)((auVar178._0_4_ * 0x6200 & 0xffff0000U) + auVar103._0_4_ * 0x8b00) >> 0x10;
  auVar179._4_4_ = (int)((auVar178._4_4_ * 0x6200 & 0xffff0000U) + auVar103._4_4_ * 0x8b00) >> 0x10;
  auVar179._8_4_ =
       (int)((uVar184 & 0xffff0000) + (int)((auVar103._8_8_ & 0xffffffff) * 0x8b00)) >> 0x10;
  auVar179._12_4_ =
       (int)((uVar122 & 0xffff0000) + (int)((auVar40._8_8_ & 0xffffffff) * 0x8b00)) >> 0x10;
  auVar99 = packssdw(auVar179,auVar192);
  sVar87 = sVar130 + auVar99._0_2_;
  sVar164 = sVar137 + auVar99._2_2_;
  sVar166 = sVar138 + auVar99._4_2_;
  sVar169 = sVar139 + auVar99._6_2_;
  sVar171 = sVar140 + auVar99._8_2_;
  sVar32 = sVar141 + auVar99._10_2_;
  sVar33 = sVar142 + auVar99._12_2_;
  sVar34 = sVar143 + auVar99._14_2_;
  sVar130 = sVar130 - auVar99._0_2_;
  sVar137 = sVar137 - auVar99._2_2_;
  sVar138 = sVar138 - auVar99._4_2_;
  sVar139 = sVar139 - auVar99._6_2_;
  sVar140 = sVar140 - auVar99._8_2_;
  sVar141 = sVar141 - auVar99._10_2_;
  sVar142 = sVar142 - auVar99._12_2_;
  sVar143 = sVar143 - auVar99._14_2_;
  auVar193._0_4_ = (int)((auVar57._0_4_ * 0x14e00 & 0xffff0000U) + auVar49._0_4_ * 0x6200) >> 0x10;
  auVar193._4_4_ = (int)((uVar73 & 0xffff0000) + auVar49._4_4_ * 0x6200) >> 0x10;
  auVar193._8_4_ =
       (int)(((uint)((auVar57._8_8_ & 0xffffffff) * 0x14e00) & 0xffff0000) + uVar25) >> 0x10;
  auVar193._12_4_ = (int)((uVar89 & 0xffff0000) + uVar123) >> 0x10;
  auVar186._0_4_ = (int)((auVar81._0_4_ * 0x14e00 & 0xffff0000U) + auVar178._0_4_ * 0x6200) >> 0x10;
  auVar186._4_4_ = (int)((auVar81._4_4_ * 0x14e00 & 0xffff0000U) + auVar178._4_4_ * 0x6200) >> 0x10;
  auVar186._8_4_ =
       (int)(((uint)((auVar81._8_8_ & 0xffffffff) * 0x14e00) & 0xffff0000) + uVar184) >> 0x10;
  auVar186._12_4_ =
       (int)(((uint)((auVar106._8_8_ & 0xffffffff) * 0x14e00) & 0xffff0000) + uVar122) >> 0x10;
  auVar99 = packssdw(auVar186,auVar193);
  sVar71 = sVar48 + auVar99._0_2_;
  sVar180 = sVar70 + auVar99._2_2_;
  sVar181 = sVar72 + auVar99._4_2_;
  sVar182 = sVar85 + auVar99._6_2_;
  sVar183 = sVar86 + auVar99._8_2_;
  sVar127 = sVar26 + auVar99._10_2_;
  sVar35 = sVar53 + auVar99._12_2_;
  sVar36 = sVar31 + auVar99._14_2_;
  sVar48 = sVar48 - auVar99._0_2_;
  sVar70 = sVar70 - auVar99._2_2_;
  sVar72 = sVar72 - auVar99._4_2_;
  sVar85 = sVar85 - auVar99._6_2_;
  sVar86 = sVar86 - auVar99._8_2_;
  sVar26 = sVar26 - auVar99._10_2_;
  sVar53 = sVar53 - auVar99._12_2_;
  sVar31 = sVar31 - auVar99._14_2_;
  auVar50._0_4_ = CONCAT22(sVar140,sVar66);
  uVar27 = CONCAT22(sVar171,sVar170);
  auVar1._4_8_ = (ulong)CONCAT22(sVar85,sVar150) << 0x20;
  auVar1._0_4_ = uVar27;
  auVar187._0_8_ = auVar1._0_8_ << 0x20;
  auVar187._8_4_ = uVar27;
  auVar187._12_4_ = uVar27;
  auVar2._4_8_ = auVar187._8_8_;
  auVar2._0_4_ = CONCAT22(sVar86,sVar151);
  auVar188._0_8_ = auVar2._0_8_ << 0x20;
  auVar188._8_4_ = uVar27;
  auVar188._12_4_ = CONCAT22(sVar86,sVar151);
  auVar99._4_8_ = auVar188._8_8_;
  auVar99._0_4_ = auVar50._0_4_;
  auVar99._12_4_ = 0;
  sVar37 = sVar124 + sVar94;
  sVar38 = sVar36 + sVar71;
  sVar42 = sVar69 + sVar65;
  sVar43 = sVar143 + sVar130;
  sVar44 = sVar174 + sVar159;
  sVar45 = sVar34 + sVar87;
  sVar46 = sVar157 + sVar144;
  sVar47 = sVar31 + sVar48;
  sVar94 = sVar94 - sVar124;
  sVar71 = sVar71 - sVar36;
  sVar65 = sVar65 - sVar69;
  sVar130 = sVar130 - sVar143;
  sVar159 = sVar159 - sVar174;
  sVar87 = sVar87 - sVar34;
  sVar144 = sVar144 - sVar157;
  sVar48 = sVar48 - sVar31;
  sVar69 = sVar116 + sVar114;
  sVar91 = sVar35 + sVar180;
  sVar93 = sVar68 + sVar147 + sVar88;
  sVar115 = sVar142 + sVar137;
  sVar117 = sVar173 + sVar163;
  sVar119 = sVar33 + sVar164;
  sVar121 = sVar155 + (sVar147 - sVar88);
  sVar125 = sVar53 + sVar70;
  sVar114 = sVar114 - sVar116;
  sVar180 = sVar180 - sVar35;
  sVar68 = (sVar147 + sVar88) - sVar68;
  sVar137 = sVar137 - sVar142;
  sVar163 = sVar163 - sVar173;
  sVar164 = sVar164 - sVar33;
  sVar155 = (sVar147 - sVar88) - sVar155;
  sVar70 = sVar70 - sVar53;
  sVar53 = sVar118 + sVar120;
  sVar116 = sVar127 + sVar181;
  sVar124 = sVar67 + sVar148 + sVar92;
  sVar31 = sVar141 + sVar138;
  sVar33 = sVar172 + sVar165;
  sVar34 = sVar32 + sVar166;
  sVar35 = sVar153 + (sVar148 - sVar92);
  sVar36 = sVar26 + sVar72;
  sVar120 = sVar120 - sVar118;
  sVar181 = sVar181 - sVar127;
  sVar167 = (sVar148 + sVar92) - sVar67;
  sVar138 = sVar138 - sVar141;
  sVar165 = sVar165 - sVar172;
  sVar166 = sVar166 - sVar32;
  sVar153 = (sVar148 - sVar92) - sVar153;
  sVar72 = sVar72 - sVar26;
  sVar118 = sVar128 + sVar126;
  sVar26 = sVar183 + sVar182;
  sVar32 = sVar66 + sVar149 + sVar95;
  sVar88 = sVar140 + sVar139;
  sVar92 = sVar170 + sVar168;
  sVar127 = sVar171 + sVar169;
  sVar157 = sVar118 + sVar37;
  sVar172 = sVar26 + sVar38;
  sVar173 = sVar32 + sVar42;
  sVar174 = sVar88 + sVar43;
  sVar152 = sVar92 + sVar44;
  sVar154 = sVar127 + sVar45;
  sVar156 = sVar151 + sVar150 + sVar46;
  sVar158 = sVar86 + sVar85 + sVar47;
  sVar37 = sVar37 - sVar118;
  sVar38 = sVar38 - sVar26;
  sVar42 = sVar42 - sVar32;
  sVar43 = sVar43 - sVar88;
  sVar44 = sVar44 - sVar92;
  sVar45 = sVar45 - sVar127;
  sVar46 = sVar46 - (sVar151 + sVar150);
  sVar47 = sVar47 - (sVar86 + sVar85);
  sVar88 = sVar53 + sVar69;
  sVar92 = sVar116 + sVar91;
  sVar127 = sVar124 + sVar93;
  sVar129 = sVar31 + sVar115;
  sVar142 = sVar33 + sVar117;
  sVar143 = sVar34 + sVar119;
  sVar147 = sVar35 + sVar121;
  sVar148 = sVar36 + sVar125;
  sVar118 = sVar172 + sVar92;
  auVar13._0_4_ = CONCAT22(sVar118,sVar157 + sVar88);
  sVar26 = sVar173 + sVar127;
  auVar14._0_6_ = CONCAT24(sVar26,auVar13._0_4_);
  sVar32 = sVar174 + sVar129;
  auVar15._0_8_ = CONCAT26(sVar32,auVar14._0_6_);
  auVar12._0_10_ = CONCAT28(sVar152 + sVar142,auVar15._0_8_);
  auVar12._10_2_ = sVar154 + sVar143;
  auVar133._12_2_ = sVar156 + sVar147;
  auVar133._0_12_ = auVar12;
  auVar133._14_2_ = sVar158 + sVar148;
  *(undefined1 (*) [16])data = auVar133;
  data[0x20] = sVar157 - sVar88;
  data[0x21] = sVar172 - sVar92;
  data[0x22] = sVar173 - sVar127;
  data[0x23] = sVar174 - sVar129;
  data[0x24] = sVar152 - sVar142;
  data[0x25] = sVar154 - sVar143;
  data[0x26] = sVar156 - sVar147;
  data[0x27] = sVar158 - sVar148;
  auVar17._12_2_ = sVar32;
  auVar17._0_12_ = auVar12;
  auVar17._14_2_ = sVar115 - sVar31;
  auVar16._12_4_ = auVar17._12_4_;
  auVar16._10_2_ = sVar93 - sVar124;
  auVar16._0_10_ = auVar12._0_10_;
  auVar15._10_6_ = auVar16._10_6_;
  auVar15._8_2_ = sVar26;
  auVar14._8_8_ = auVar15._8_8_;
  auVar14._6_2_ = sVar91 - sVar116;
  auVar13._6_10_ = auVar14._6_10_;
  auVar13._4_2_ = sVar118;
  Var8 = CONCAT64(CONCAT42(CONCAT22(sVar43,sVar129),sVar42),CONCAT22(sVar127,sVar129));
  auVar6._4_8_ = (long)((unkuint10)Var8 >> 0x10);
  auVar6._2_2_ = sVar38;
  auVar6._0_2_ = sVar92;
  auVar131._0_4_ = (int)sVar37 + (int)(short)(sVar69 - sVar53);
  auVar131._4_4_ = (auVar6._0_4_ >> 0x10) + (auVar13._4_4_ >> 0x10);
  auVar131._8_4_ = ((int)((unkuint10)Var8 >> 0x10) >> 0x10) + (auVar15._8_4_ >> 0x10);
  auVar131._12_4_ = (int)sVar43 + (auVar16._12_4_ >> 0x10);
  auVar18._0_4_ = (int)sVar44 + (int)(short)(sVar117 - sVar33);
  auVar18._4_4_ = (int)sVar45 + (int)(short)(sVar119 - sVar34);
  auVar18._8_4_ = (int)sVar46 + (int)(short)(sVar121 - sVar35);
  auVar18._12_4_ = (int)sVar47 + (int)(short)(sVar125 - sVar36);
  auVar107._4_4_ = auVar131._4_4_;
  auVar107._0_4_ = auVar131._4_4_;
  auVar107._8_4_ = auVar131._12_4_;
  auVar107._12_4_ = auVar131._12_4_;
  auVar108._4_4_ = auVar18._4_4_;
  auVar108._0_4_ = auVar18._4_4_;
  auVar108._8_4_ = auVar18._12_4_;
  auVar108._12_4_ = auVar18._12_4_;
  lVar90 = (auVar108._8_8_ & 0xffffffff) * 0xb500;
  iVar194 = (int)((ulong)auVar18._4_4_ * 0xb500);
  auVar96._8_4_ = (int)lVar90;
  auVar96._0_8_ = CONCAT44(auVar96._8_4_,iVar194);
  auVar19._0_4_ = auVar18._0_4_ * 0xb500 >> 0x10;
  auVar19._4_4_ = iVar194 >> 0x10;
  auVar19._8_4_ = (int)((auVar18._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar19._12_4_ = auVar96._8_4_ >> 0x10;
  auVar132._0_4_ = auVar131._0_4_ * 0xb500 >> 0x10;
  auVar132._4_4_ = auVar131._4_4_ * 0xb500 >> 0x10;
  auVar132._8_4_ = (int)((auVar131._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar132._12_4_ = (int)((auVar107._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar133 = packssdw(auVar132,auVar19);
  data[0x10] = sVar37 + auVar133._0_2_;
  data[0x11] = sVar38 + auVar133._2_2_;
  data[0x12] = sVar42 + auVar133._4_2_;
  data[0x13] = sVar43 + auVar133._6_2_;
  data[0x14] = sVar44 + auVar133._8_2_;
  data[0x15] = sVar45 + auVar133._10_2_;
  data[0x16] = sVar46 + auVar133._12_2_;
  data[0x17] = sVar47 + auVar133._14_2_;
  data[0x30] = sVar37 - auVar133._0_2_;
  data[0x31] = sVar38 - auVar133._2_2_;
  data[0x32] = sVar42 - auVar133._4_2_;
  data[0x33] = sVar43 - auVar133._6_2_;
  data[0x34] = sVar44 - auVar133._8_2_;
  data[0x35] = sVar45 - auVar133._10_2_;
  data[0x36] = sVar46 - auVar133._12_2_;
  data[0x37] = sVar47 - auVar133._14_2_;
  sVar53 = sVar138 + sVar137;
  uVar185 = sVar155 + sVar144;
  auVar112._12_2_ = (short)((ulong)lVar90 >> 0x10);
  auVar112._0_12_ = auVar96;
  auVar112._14_2_ = (sVar139 + sVar138) - sVar140;
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._0_10_ = auVar96._0_10_;
  auVar111._10_2_ = (sVar149 + sVar95 + sVar167) - sVar66;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = (short)lVar90;
  auVar110._0_8_ = auVar96._0_8_;
  auVar109._8_8_ = auVar110._8_8_;
  auVar109._6_2_ = (sVar182 + sVar181) - sVar183;
  auVar109._4_2_ = (short)((ulong)auVar18._4_4_ * 0xb500 >> 0x10);
  auVar113._0_4_ = (int)(short)((sVar126 + sVar120) - sVar128);
  auVar113._4_4_ = auVar109._4_4_ >> 0x10;
  auVar113._8_4_ = auVar110._8_4_ >> 0x10;
  auVar113._12_4_ = auVar111._12_4_ >> 0x10;
  auVar64._0_4_ = (int)(short)((sVar168 + sVar165) - sVar170);
  auVar64._4_4_ = (int)(short)((sVar169 + sVar166) - sVar171);
  auVar64._8_4_ = (int)(short)((sVar150 + sVar153) - sVar151);
  auVar64._12_4_ = (int)(short)((sVar85 + sVar72) - sVar86);
  auVar134._4_4_ = auVar64._4_4_;
  auVar134._0_4_ = auVar64._4_4_;
  auVar134._8_4_ = auVar64._12_4_;
  auVar134._12_4_ = auVar64._12_4_;
  auVar175._4_4_ = auVar113._4_4_;
  auVar175._0_4_ = auVar113._4_4_;
  auVar175._8_4_ = auVar113._12_4_;
  auVar175._12_4_ = auVar113._12_4_;
  auVar190._0_12_ = SUB1612(auVar99 << 0x20,0);
  auVar190._12_2_ = sVar140;
  auVar190._14_2_ = sVar137 + sVar130;
  auVar189._12_4_ = auVar190._12_4_;
  auVar189._0_10_ = SUB1610(auVar99 << 0x20,0);
  auVar189._10_2_ = sVar68 + sVar65;
  auVar10._4_2_ = sVar66;
  auVar10._0_4_ = auVar50._0_4_;
  auVar10._6_6_ = auVar189._10_6_;
  auVar7._4_8_ = auVar10._4_8_;
  auVar7._2_2_ = sVar180 + sVar71;
  auVar7._0_2_ = sVar183;
  auVar191._0_4_ = (int)(short)(sVar114 + sVar94);
  auVar191._4_4_ = auVar7._0_4_ >> 0x10;
  auVar191._8_4_ = auVar10._4_4_ >> 0x10;
  auVar191._12_4_ = auVar189._12_4_ >> 0x10;
  auVar11._10_2_ = sVar70 + sVar48;
  auVar11._0_10_ = (unkuint10)uVar185 << 0x30;
  auVar135._0_4_ = (int)(short)(sVar163 + sVar159);
  auVar135._4_4_ = (int)(short)(sVar164 + sVar87);
  auVar135._8_4_ = (int)(short)uVar185;
  auVar135._12_4_ = auVar11._8_4_ >> 0x10;
  auVar20._0_4_ = auVar64._0_4_ - auVar135._0_4_;
  auVar20._4_4_ = auVar64._4_4_ - auVar135._4_4_;
  auVar20._8_4_ = auVar64._8_4_ - auVar135._8_4_;
  auVar20._12_4_ = auVar64._12_4_ - auVar135._12_4_;
  auVar145._0_4_ = auVar113._0_4_ - auVar191._0_4_;
  auVar145._4_4_ = auVar113._4_4_ - auVar191._4_4_;
  auVar145._8_4_ = auVar113._8_4_ - auVar191._8_4_;
  auVar145._12_4_ = auVar113._12_4_ - auVar191._12_4_;
  auVar176._4_4_ = auVar145._4_4_;
  auVar176._0_4_ = auVar145._4_4_;
  auVar176._8_4_ = auVar145._12_4_;
  auVar176._12_4_ = auVar145._12_4_;
  uVar73 = (uint)((auVar145._8_8_ & 0xffffffff) * 0x6200);
  uVar89 = (uint)((auVar176._8_8_ & 0xffffffff) * 0x6200);
  auVar177._4_4_ = auVar20._4_4_;
  auVar177._0_4_ = auVar20._4_4_;
  auVar177._8_4_ = auVar20._12_4_;
  auVar177._12_4_ = auVar20._12_4_;
  uVar25 = (uint)((auVar20._8_8_ & 0xffffffff) * 0x6200);
  uVar122 = (uint)((auVar177._8_8_ & 0xffffffff) * 0x6200);
  auVar21._4_4_ = auVar191._4_4_;
  auVar21._0_4_ = auVar191._4_4_;
  auVar21._8_4_ = auVar191._12_4_;
  auVar21._12_4_ = auVar191._12_4_;
  auVar22._4_4_ = auVar135._4_4_;
  auVar22._0_4_ = auVar135._4_4_;
  auVar22._8_4_ = auVar135._12_4_;
  auVar22._12_4_ = auVar135._12_4_;
  auVar23._0_4_ = (int)(short)(sVar165 + sVar163);
  auVar23._4_4_ = (int)(short)(sVar166 + sVar164);
  auVar23._8_4_ = (int)(short)(sVar153 + sVar155);
  auVar23._12_4_ = (int)(short)(sVar72 + sVar70);
  Var8 = CONCAT64(CONCAT42(CONCAT22(sVar53,sVar141),sVar167 + sVar68),CONCAT22(sVar67,sVar141));
  auVar50._8_8_ = (undefined8)((unkuint10)Var8 >> 0x10);
  auVar50._6_2_ = sVar181 + sVar180;
  auVar50._4_2_ = sVar140;
  auVar51._0_4_ = (int)(short)(sVar120 + sVar114);
  auVar51._4_4_ = auVar50._4_4_ >> 0x10;
  auVar51._8_4_ = (int)((unkuint10)Var8 >> 0x10) >> 0x10;
  auVar51._12_4_ = (int)sVar53;
  auVar161._4_4_ = auVar51._4_4_;
  auVar161._0_4_ = auVar51._4_4_;
  auVar161._8_4_ = auVar51._12_4_;
  auVar161._12_4_ = auVar51._12_4_;
  auVar162._4_4_ = auVar23._4_4_;
  auVar162._0_4_ = auVar23._4_4_;
  auVar162._8_4_ = auVar23._12_4_;
  auVar162._12_4_ = auVar23._12_4_;
  auVar24._0_4_ = auVar23._0_4_ * 0xb500 >> 0x10;
  auVar24._4_4_ = auVar23._4_4_ * 0xb500 >> 0x10;
  auVar24._8_4_ = (int)((auVar23._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar24._12_4_ = (int)((auVar162._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar52._0_4_ = auVar51._0_4_ * 0xb500 >> 0x10;
  auVar52._4_4_ = auVar51._4_4_ * 0xb500 >> 0x10;
  auVar52._8_4_ = (int)((auVar51._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar52._12_4_ = (int)((auVar161._8_8_ & 0xffffffff) * 0xb500) >> 0x10;
  auVar99 = packssdw(auVar52,auVar24);
  sVar53 = sVar94 + auVar99._0_2_;
  sVar114 = sVar71 + auVar99._2_2_;
  sVar116 = sVar65 + auVar99._4_2_;
  sVar118 = sVar130 + auVar99._6_2_;
  sVar120 = sVar159 + auVar99._8_2_;
  sVar124 = sVar87 + auVar99._10_2_;
  sVar26 = sVar144 + auVar99._12_2_;
  sVar126 = sVar48 + auVar99._14_2_;
  sVar94 = sVar94 - auVar99._0_2_;
  sVar71 = sVar71 - auVar99._2_2_;
  sVar65 = sVar65 - auVar99._4_2_;
  sVar130 = sVar130 - auVar99._6_2_;
  sVar159 = sVar159 - auVar99._8_2_;
  sVar87 = sVar87 - auVar99._10_2_;
  sVar144 = sVar144 - auVar99._12_2_;
  sVar48 = sVar48 - auVar99._14_2_;
  auVar146._0_4_ = (int)((auVar20._0_4_ * 0x6200 & 0xffff0000U) + auVar64._0_4_ * 0x8b00) >> 0x10;
  auVar146._4_4_ = (int)((auVar20._4_4_ * 0x6200 & 0xffff0000U) + auVar64._4_4_ * 0x8b00) >> 0x10;
  auVar146._8_4_ =
       (int)((uVar25 & 0xffff0000) + (int)((auVar64._8_8_ & 0xffffffff) * 0x8b00)) >> 0x10;
  auVar146._12_4_ =
       (int)((uVar122 & 0xffff0000) + (int)((auVar134._8_8_ & 0xffffffff) * 0x8b00)) >> 0x10;
  auVar30._0_4_ = (int)((auVar145._0_4_ * 0x6200 & 0xffff0000U) + auVar113._0_4_ * 0x8b00) >> 0x10;
  auVar30._4_4_ = (int)((auVar145._4_4_ * 0x6200 & 0xffff0000U) + auVar113._4_4_ * 0x8b00) >> 0x10;
  auVar30._8_4_ =
       (int)((uVar73 & 0xffff0000) + (int)((auVar113._8_8_ & 0xffffffff) * 0x8b00)) >> 0x10;
  auVar30._12_4_ =
       (int)((uVar89 & 0xffff0000) + (int)((auVar175._8_8_ & 0xffffffff) * 0x8b00)) >> 0x10;
  auVar99 = packssdw(auVar30,auVar146);
  data[0x28] = sVar94 + auVar99._0_2_;
  data[0x29] = sVar71 + auVar99._2_2_;
  data[0x2a] = sVar65 + auVar99._4_2_;
  data[0x2b] = sVar130 + auVar99._6_2_;
  data[0x2c] = sVar159 + auVar99._8_2_;
  data[0x2d] = sVar87 + auVar99._10_2_;
  data[0x2e] = sVar144 + auVar99._12_2_;
  data[0x2f] = sVar48 + auVar99._14_2_;
  data[0x18] = sVar94 - auVar99._0_2_;
  data[0x19] = sVar71 - auVar99._2_2_;
  data[0x1a] = sVar65 - auVar99._4_2_;
  data[0x1b] = sVar130 - auVar99._6_2_;
  data[0x1c] = sVar159 - auVar99._8_2_;
  data[0x1d] = sVar87 - auVar99._10_2_;
  data[0x1e] = sVar144 - auVar99._12_2_;
  data[0x1f] = sVar48 - auVar99._14_2_;
  auVar136._0_4_ = (int)((auVar135._0_4_ * 0x14e00 & 0xffff0000U) + auVar20._0_4_ * 0x6200) >> 0x10;
  auVar136._4_4_ = (int)((auVar135._4_4_ * 0x14e00 & 0xffff0000U) + auVar20._4_4_ * 0x6200) >> 0x10;
  auVar136._8_4_ =
       (int)(((uint)((auVar135._8_8_ & 0xffffffff) * 0x14e00) & 0xffff0000) + uVar25) >> 0x10;
  auVar136._12_4_ =
       (int)(((uint)((auVar22._8_8_ & 0xffffffff) * 0x14e00) & 0xffff0000) + uVar122) >> 0x10;
  auVar41._0_4_ = (int)((auVar191._0_4_ * 0x14e00 & 0xffff0000U) + auVar145._0_4_ * 0x6200) >> 0x10;
  auVar41._4_4_ = (int)((auVar191._4_4_ * 0x14e00 & 0xffff0000U) + auVar145._4_4_ * 0x6200) >> 0x10;
  auVar41._8_4_ =
       (int)(((uint)((auVar191._8_8_ & 0xffffffff) * 0x14e00) & 0xffff0000) + uVar73) >> 0x10;
  auVar41._12_4_ =
       (int)(((uint)((auVar21._8_8_ & 0xffffffff) * 0x14e00) & 0xffff0000) + uVar89) >> 0x10;
  auVar99 = packssdw(auVar41,auVar136);
  data[8] = sVar53 + auVar99._0_2_;
  data[9] = sVar114 + auVar99._2_2_;
  data[10] = sVar116 + auVar99._4_2_;
  data[0xb] = sVar118 + auVar99._6_2_;
  data[0xc] = sVar120 + auVar99._8_2_;
  data[0xd] = sVar124 + auVar99._10_2_;
  data[0xe] = sVar26 + auVar99._12_2_;
  data[0xf] = sVar126 + auVar99._14_2_;
  data[0x38] = sVar53 - auVar99._0_2_;
  data[0x39] = sVar114 - auVar99._2_2_;
  data[0x3a] = sVar116 - auVar99._4_2_;
  data[0x3b] = sVar118 - auVar99._6_2_;
  data[0x3c] = sVar120 - auVar99._8_2_;
  data[0x3d] = sVar124 - auVar99._10_2_;
  data[0x3e] = sVar26 - auVar99._12_2_;
  data[0x3f] = sVar126 - auVar99._14_2_;
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_ifast(DCTELEM *data)
{
  DCTELEM tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  DCTELEM tmp10, tmp11, tmp12, tmp13;
  DCTELEM z1, z2, z3, z4, z5, z11, z13;
  DCTELEM *dataptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[0] + dataptr[7];
    tmp7 = dataptr[0] - dataptr[7];
    tmp1 = dataptr[1] + dataptr[6];
    tmp6 = dataptr[1] - dataptr[6];
    tmp2 = dataptr[2] + dataptr[5];
    tmp5 = dataptr[2] - dataptr[5];
    tmp3 = dataptr[3] + dataptr[4];
    tmp4 = dataptr[3] - dataptr[4];

    /* Even part */

    tmp10 = tmp0 + tmp3;        /* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[0] = tmp10 + tmp11; /* phase 3 */
    dataptr[4] = tmp10 - tmp11;

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_707106781); /* c4 */
    dataptr[2] = tmp13 + z1;    /* phase 5 */
    dataptr[6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;        /* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = MULTIPLY(tmp10 - tmp12, FIX_0_382683433); /* c6 */
    z2 = MULTIPLY(tmp10, FIX_0_541196100) + z5; /* c2-c6 */
    z4 = MULTIPLY(tmp12, FIX_1_306562965) + z5; /* c2+c6 */
    z3 = MULTIPLY(tmp11, FIX_0_707106781); /* c4 */

    z11 = tmp7 + z3;            /* phase 5 */
    z13 = tmp7 - z3;

    dataptr[5] = z13 + z2;      /* phase 6 */
    dataptr[3] = z13 - z2;
    dataptr[1] = z11 + z4;
    dataptr[7] = z11 - z4;

    dataptr += DCTSIZE;         /* advance pointer to next row */
  }

  /* Pass 2: process columns. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE * 0] + dataptr[DCTSIZE * 7];
    tmp7 = dataptr[DCTSIZE * 0] - dataptr[DCTSIZE * 7];
    tmp1 = dataptr[DCTSIZE * 1] + dataptr[DCTSIZE * 6];
    tmp6 = dataptr[DCTSIZE * 1] - dataptr[DCTSIZE * 6];
    tmp2 = dataptr[DCTSIZE * 2] + dataptr[DCTSIZE * 5];
    tmp5 = dataptr[DCTSIZE * 2] - dataptr[DCTSIZE * 5];
    tmp3 = dataptr[DCTSIZE * 3] + dataptr[DCTSIZE * 4];
    tmp4 = dataptr[DCTSIZE * 3] - dataptr[DCTSIZE * 4];

    /* Even part */

    tmp10 = tmp0 + tmp3;        /* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE * 0] = tmp10 + tmp11; /* phase 3 */
    dataptr[DCTSIZE * 4] = tmp10 - tmp11;

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_707106781); /* c4 */
    dataptr[DCTSIZE * 2] = tmp13 + z1; /* phase 5 */
    dataptr[DCTSIZE * 6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;        /* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = MULTIPLY(tmp10 - tmp12, FIX_0_382683433); /* c6 */
    z2 = MULTIPLY(tmp10, FIX_0_541196100) + z5; /* c2-c6 */
    z4 = MULTIPLY(tmp12, FIX_1_306562965) + z5; /* c2+c6 */
    z3 = MULTIPLY(tmp11, FIX_0_707106781); /* c4 */

    z11 = tmp7 + z3;            /* phase 5 */
    z13 = tmp7 - z3;

    dataptr[DCTSIZE * 5] = z13 + z2; /* phase 6 */
    dataptr[DCTSIZE * 3] = z13 - z2;
    dataptr[DCTSIZE * 1] = z11 + z4;
    dataptr[DCTSIZE * 7] = z11 - z4;

    dataptr++;                  /* advance pointer to next column */
  }
}